

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  uchar uVar2;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  ulong uVar5;
  long intime;
  ulong uVar6;
  int iVar7;
  CURLcode CVar8;
  time_t tVar9;
  char *pcVar10;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  tm buffer;
  char timebuf [24];
  
  pFVar3 = (data->req).p.file;
  if (ftpcode == 0x226) {
    pcVar10 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_0013062b:
    Curl_infof(data,pcVar10);
  }
  else {
    if (ftpcode != 0xd5) {
      pcVar10 = "unsupported MDTM reply format";
      goto LAB_0013062b;
    }
    pcVar4 = data->conn;
    iVar7 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day,
                            &hour,&minute,&second);
    if (iVar7 == 6) {
      curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                     (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                     (ulong)(uint)second);
      tVar9 = Curl_getdate_capped(timebuf);
      (data->info).filetime = tVar9;
    }
    uVar5 = *(ulong *)&(data->set).field_0x8e2;
    if ((((((uint)uVar5 >> 0x19 & 1) != 0) && ((uVar5 & 0x20) != 0)) &&
        ((pcVar4->proto).ftpc.file != (char *)0x0)) && (intime = (data->info).filetime, -1 < intime)
       ) {
      CVar8 = Curl_gmtime(intime,&buffer);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      iVar7 = 6;
      if (buffer.tm_wday != 0) {
        iVar7 = buffer.tm_wday + -1;
      }
      iVar7 = curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                             Curl_wkday[iVar7],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon]
                             ,(ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                             (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar8 = Curl_client_write(data,3,timebuf,(long)iVar7);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
    }
  }
  uVar2 = (data->set).timecondition;
  if (uVar2 != '\0') {
    uVar5 = (data->info).filetime;
    if (((long)uVar5 < 1) || (uVar6 = (data->set).timevalue, (long)uVar6 < 1)) {
      Curl_infof(data,"Skipping time comparison");
    }
    else if (uVar2 == '\x02') {
      if (uVar6 < uVar5) {
        pcVar10 = "The requested document is not old enough";
LAB_001306a5:
        Curl_infof(data,pcVar10);
        pFVar3->fd = 2;
        puVar1 = &(data->info).field_0xec;
        *puVar1 = *puVar1 | 1;
        (data->conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
    }
    else if (uVar5 <= uVar6) {
      pcVar10 = "The requested document is not new enough";
      goto LAB_001306a5;
    }
  }
  CVar8 = ftp_state_type(data);
  return CVar8;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen = msnprintf(headerbuf, sizeof(headerbuf),
                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                  Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                  tm->tm_mday,
                  Curl_month[tm->tm_mon],
                  tm->tm_year + 1900,
                  tm->tm_hour,
                  tm->tm_min,
                  tm->tm_sec);
        result = Curl_client_write(data, CLIENTWRITE_BOTH, headerbuf,
                                   headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}